

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationRootElements::getFirstSecTerForPrimary(CollationRootElements *this,int32_t index)

{
  uint uVar1;
  
  uVar1 = this->elements[index] & 0xffffff7f;
  if (0x50004ff < uVar1) {
    uVar1 = 0x5000500;
  }
  if (-1 < (char)this->elements[index]) {
    uVar1 = 0x5000500;
  }
  return uVar1;
}

Assistant:

uint32_t
CollationRootElements::getFirstSecTerForPrimary(int32_t index) const {
    uint32_t secTer = elements[index];
    if((secTer & SEC_TER_DELTA_FLAG) == 0) {
        // No sec/ter delta.
        return Collation::COMMON_SEC_AND_TER_CE;
    }
    secTer &= ~SEC_TER_DELTA_FLAG;
    if(secTer > Collation::COMMON_SEC_AND_TER_CE) {
        // Implied sec/ter.
        return Collation::COMMON_SEC_AND_TER_CE;
    }
    // Explicit sec/ter below common/common.
    return secTer;
}